

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_function(CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRFunction *func_00;
  mapped_type *pmVar6;
  TypedID<(spirv_cross::Types)0> *__first;
  TypedID<(spirv_cross::Types)0> *__last;
  SPIRType *pSVar7;
  TypedID<(spirv_cross::Types)2> *pTVar8;
  TypedID<(spirv_cross::Types)2> *pTVar9;
  TypedID<(spirv_cross::Types)6> *pTVar10;
  SPIRBlock *pSVar11;
  Vector<std::function<void_()>_> *this_00;
  function<void_()> *pfVar12;
  SPIRVariable *pSVar13;
  char (*in_R8) [12];
  SPIRVariable *var_1;
  TypedID<(spirv_cross::Types)2> *v_1;
  TypedID<(spirv_cross::Types)2> *__end1_5;
  TypedID<(spirv_cross::Types)2> *__begin1_5;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range1_5;
  function<void_()> *line;
  function<void_()> *__end1_4;
  function<void_()> *__begin1_4;
  Vector<std::function<void_()>_> *__range1_4;
  SPIRBlock *block_1;
  TypedID<(spirv_cross::Types)6> *block_id;
  TypedID<(spirv_cross::Types)6> *__end1_3;
  TypedID<(spirv_cross::Types)6> *__begin1_3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1_3;
  string local_1c0;
  TypedID<(spirv_cross::Types)2> local_19c;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_198;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *dominated;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  SPIRVariable *local_150;
  SPIRVariable *var;
  TypedID<(spirv_cross::Types)2> *v;
  TypedID<(spirv_cross::Types)2> *__end1_2;
  TypedID<(spirv_cross::Types)2> *__begin1_2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range1_2;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  SPIRType *local_b8;
  SPIRType *type;
  SPIRConstant *c;
  TypedID<(spirv_cross::Types)0> *array;
  TypedID<(spirv_cross::Types)0> *__end1_1;
  TypedID<(spirv_cross::Types)0> *__begin1_1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1_1;
  SPIRBlock *entry_block;
  uint32_t local_78;
  uint local_74;
  uint32_t id;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end2;
  Instruction *__begin2;
  SmallVector<spirv_cross::Instruction,_8UL> *__range2;
  SPIRBlock *b;
  TypedID<(spirv_cross::Types)6> *pTStack_38;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  Bitset *return_flags_local;
  SPIRFunction *func_local;
  CompilerGLSL *this_local;
  
  if ((func->active & 1U) == 0) {
    func->active = true;
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                       (&(func->blocks).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    pTStack_38 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                           (&(func->blocks).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    for (; __end1 != pTStack_38; __end1 = __end1 + 1) {
      b._4_4_ = __end1->id;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&b + 4));
      __range2 = (SmallVector<spirv_cross::Instruction,_8UL> *)
                 Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
      __begin2 = (Instruction *)&((SPIRBlock *)__range2)->ops;
      __end2 = VectorView<spirv_cross::Instruction>::begin
                         ((VectorView<spirv_cross::Instruction> *)__begin2);
      i = VectorView<spirv_cross::Instruction>::end
                    ((VectorView<spirv_cross::Instruction> *)__begin2);
      for (; __end2 != i; __end2 = __end2 + 1) {
        ops = (uint32_t *)__end2;
        _id = Compiler::stream(&this->super_Compiler,__end2);
        local_74 = (uint)(ushort)*ops;
        if (local_74 == 0x39) {
          local_78 = _id[2];
          func_00 = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,local_78);
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&entry_block + 4),_id[1]);
          pmVar6 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_Compiler).ir.meta,(key_type *)((long)&entry_block + 4)
                               );
          emit_function(this,func_00,&(pmVar6->decoration).decoration_flags);
        }
      }
    }
    if ((func->entry_line).file_id != 0) {
      emit_line_directive(this,(func->entry_line).file_id,(func->entry_line).line_literal);
    }
    (*(this->super_Compiler)._vptr_Compiler[7])(this,func,return_flags);
    begin_scope(this);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->super_Compiler).ir.default_entry_point);
    if (uVar3 == uVar4) {
      (*(this->super_Compiler)._vptr_Compiler[0x3d])();
    }
    (this->super_Compiler).current_function = func;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&func->entry_block);
    __range1_1 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                 Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
    __first = ::std::
              begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                        (&func->constant_arrays_needed_on_stack);
    __last = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                       (&func->constant_arrays_needed_on_stack);
    ::std::sort<spirv_cross::TypedID<(spirv_cross::Types)0>*>(__first,__last);
    __begin1_1 = (TypedID<(spirv_cross::Types)0> *)&func->constant_arrays_needed_on_stack;
    __end1_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1_1);
    array = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1_1);
    for (; __end1_1 != array; __end1_1 = __end1_1 + 1) {
      c = (SPIRConstant *)__end1_1;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1_1);
      type = (SPIRType *)Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar3);
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(((SPIRConstant *)type)->super_IVariant).field_0xc);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
      local_b8 = pSVar7;
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[12]>
                (&local_f8,(spirv_cross *)0x490ae3,(char (*) [2])c,
                 (TypedID<(spirv_cross::Types)0> *)"_array_copy",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_d8,this,pSVar7,&local_f8);
      constant_expression_abi_cxx11_((string *)&__range1_2,this,(SPIRConstant *)type,false,false);
      in_R8 = (char (*) [12])0x4af37c;
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,&local_d8,(char (*) [4])0x4a41f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_2,
                 (char (*) [2])0x4af37c);
      ::std::__cxx11::string::~string((string *)&__range1_2);
      ::std::__cxx11::string::~string((string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    __begin1_2 = (TypedID<(spirv_cross::Types)2> *)&func->local_variables;
    __end1_2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1_2);
    v = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1_2);
    for (; __end1_2 != v; __end1_2 = __end1_2 + 1) {
      var = (SPIRVariable *)__end1_2;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1_2);
      local_150 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
      local_150->deferred_declaration = false;
      uVar5 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,local_150,4);
      if ((uVar5 & 1) == 0) {
        if (local_150->storage == StorageClassPrivate) {
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_150->super_IVariant).self);
          add_local_variable_name(this,uVar3);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_150->initializer);
          if (uVar3 == 0) {
            local_198 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                        &__range1_1[0xe].stack_storage;
            pTVar8 = ::std::
                     begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                               (local_198);
            pTVar9 = ::std::
                     end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                               (local_198);
            pTVar8 = ::std::
                     find<spirv_cross::TypedID<(spirv_cross::Types)2>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                               (pTVar8,pTVar9,&(local_150->super_IVariant).self);
            pTVar9 = ::std::
                     end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                               (local_198);
            if (pTVar8 == pTVar9) {
              pSVar1 = __range1_1 + 0xe;
              local_19c = TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(local_150->super_IVariant).self);
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
                        ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                         &pSVar1->stack_storage,&local_19c);
            }
            local_150->deferred_declaration = true;
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[0x27])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dominated,this,local_150);
            statement<std::__cxx11::string,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &dominated,(char (*) [2])0x4af37c);
            ::std::__cxx11::string::~string((string *)&dominated);
            local_150->deferred_declaration = false;
          }
        }
        else if (((local_150->storage == StorageClassFunction) &&
                 ((local_150->remapped_variable & 1U) != 0)) &&
                (uVar3 = TypedID::operator_cast_to_unsigned_int
                                   ((TypedID *)&local_150->static_expression), uVar3 != 0)) {
          local_150->deferred_declaration = false;
        }
        else {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
          bVar2 = Compiler::expression_is_lvalue(&this->super_Compiler,uVar3);
          if (bVar2) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_150->super_IVariant).self);
            add_local_variable_name(this,uVar3);
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_150->initializer);
            if ((uVar3 == 0) || ((local_150->loop_variable & 1U) != 0)) {
              local_150->deferred_declaration = true;
            }
            else {
              variable_decl_function_local_abi_cxx11_(&local_1c0,this,local_150);
              statement<std::__cxx11::string,char_const(&)[2]>
                        (this,&local_1c0,(char (*) [2])0x4af37c);
              ::std::__cxx11::string::~string((string *)&local_1c0);
            }
          }
          else {
            local_150->statically_assigned = true;
          }
        }
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_150->super_IVariant).self)
        ;
        add_local_variable_name(this,uVar3);
        (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_170,this,local_150);
        statement<std::__cxx11::string,char_const(&)[2]>(this,&local_170,(char (*) [2])0x4af37c);
        ::std::__cxx11::string::~string((string *)&local_170);
        local_150->deferred_declaration = false;
      }
      local_150->loop_variable_enable = false;
      if ((local_150->loop_variable & 1U) != 0) {
        local_150->deferred_declaration = false;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)((long)&__range1_3 + 4),0);
        (local_150->static_expression).id = __range1_3._4_4_;
      }
    }
    __end1_3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                         (&(func->blocks).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    pTVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                        (&(func->blocks).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    for (; __end1_3 != pTVar10; __end1_3 = __end1_3 + 1) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1_3);
      pSVar11 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
      pTVar8 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                         (&pSVar11->dominated_variables);
      pTVar9 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                         (&pSVar11->dominated_variables);
      ::std::sort<spirv_cross::TypedID<(spirv_cross::Types)2>*>(pTVar8,pTVar9);
    }
    this_00 = &((this->super_Compiler).current_function)->fixup_hooks_in;
    __end1_4 = VectorView<std::function<void_()>_>::begin
                         (&this_00->super_VectorView<std::function<void_()>_>);
    pfVar12 = VectorView<std::function<void_()>_>::end
                        (&this_00->super_VectorView<std::function<void_()>_>);
    for (; __end1_4 != pfVar12; __end1_4 = __end1_4 + 1) {
      ::std::function<void_()>::operator()(__end1_4);
    }
    emit_block_chain(this,(SPIRBlock *)__range1_1);
    end_scope(this);
    this->processing_entry_point = false;
    statement<char_const(&)[1]>(this,(char (*) [1])0x48ca95);
    __end1_5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                         (&(func->local_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
    pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                       (&(func->local_variables).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
    for (; __end1_5 != pTVar8; __end1_5 = __end1_5 + 1) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1_5);
      pSVar13 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar3);
      pSVar13->deferred_declaration = false;
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_function(SPIRFunction &func, const Bitset &return_flags)
{
	// Avoid potential cycles.
	if (func.active)
		return;
	func.active = true;

	// If we depend on a function, emit that function before we emit our own function.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			if (op == OpFunctionCall)
			{
				// Recursively emit functions which are called.
				uint32_t id = ops[2];
				emit_function(get<SPIRFunction>(id), ir.meta[ops[1]].decoration.decoration_flags);
			}
		}
	}

	if (func.entry_line.file_id != 0)
		emit_line_directive(func.entry_line.file_id, func.entry_line.line_literal);
	emit_function_prototype(func, return_flags);
	begin_scope();

	if (func.self == ir.default_entry_point)
		emit_entry_point_declarations();

	current_function = &func;
	auto &entry_block = get<SPIRBlock>(func.entry_block);

	sort(begin(func.constant_arrays_needed_on_stack), end(func.constant_arrays_needed_on_stack));
	for (auto &array : func.constant_arrays_needed_on_stack)
	{
		auto &c = get<SPIRConstant>(array);
		auto &type = get<SPIRType>(c.constant_type);
		statement(variable_decl(type, join("_", array, "_array_copy")), " = ", constant_expression(c), ";");
	}

	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;

		if (variable_decl_is_remapped_storage(var, StorageClassWorkgroup))
		{
			// Special variable type which cannot have initializer,
			// need to be declared as standalone variables.
			// Comes from MSL which can push global variables as local variables in main function.
			add_local_variable_name(var.self);
			statement(variable_decl(var), ";");
			var.deferred_declaration = false;
		}
		else if (var.storage == StorageClassPrivate)
		{
			// These variables will not have had their CFG usage analyzed, so move it to the entry block.
			// Comes from MSL which can push global variables as local variables in main function.
			// We could just declare them right now, but we would miss out on an important initialization case which is
			// LUT declaration in MSL.
			// If we don't declare the variable when it is assigned we're forced to go through a helper function
			// which copies elements one by one.
			add_local_variable_name(var.self);

			if (var.initializer)
			{
				statement(variable_decl(var), ";");
				var.deferred_declaration = false;
			}
			else
			{
				auto &dominated = entry_block.dominated_variables;
				if (find(begin(dominated), end(dominated), var.self) == end(dominated))
					entry_block.dominated_variables.push_back(var.self);
				var.deferred_declaration = true;
			}
		}
		else if (var.storage == StorageClassFunction && var.remapped_variable && var.static_expression)
		{
			// No need to declare this variable, it has a static expression.
			var.deferred_declaration = false;
		}
		else if (expression_is_lvalue(v))
		{
			add_local_variable_name(var.self);

			// Loop variables should never be declared early, they are explicitly emitted in a loop.
			if (var.initializer && !var.loop_variable)
				statement(variable_decl_function_local(var), ";");
			else
			{
				// Don't declare variable until first use to declutter the GLSL output quite a lot.
				// If we don't touch the variable before first branch,
				// declare it then since we need variable declaration to be in top scope.
				var.deferred_declaration = true;
			}
		}
		else
		{
			// HACK: SPIR-V in older glslang output likes to use samplers and images as local variables, but GLSL does not allow this.
			// For these types (non-lvalue), we enforce forwarding through a shadowed variable.
			// This means that when we OpStore to these variables, we just write in the expression ID directly.
			// This breaks any kind of branching, since the variable must be statically assigned.
			// Branching on samplers and images would be pretty much impossible to fake in GLSL.
			var.statically_assigned = true;
		}

		var.loop_variable_enable = false;

		// Loop variables are never declared outside their for-loop, so block any implicit declaration.
		if (var.loop_variable)
		{
			var.deferred_declaration = false;
			// Need to reset the static expression so we can fallback to initializer if need be.
			var.static_expression = 0;
		}
	}

	// Enforce declaration order for regression testing purposes.
	for (auto &block_id : func.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);
		sort(begin(block.dominated_variables), end(block.dominated_variables));
	}

	for (auto &line : current_function->fixup_hooks_in)
		line();

	emit_block_chain(entry_block);

	end_scope();
	processing_entry_point = false;
	statement("");

	// Make sure deferred declaration state for local variables is cleared when we are done with function.
	// We risk declaring Private/Workgroup variables in places we are not supposed to otherwise.
	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;
	}
}